

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::UnaryExpression::evalImpl(UnaryExpression *this,EvalContext *context)

{
  real_t real;
  real_t real_00;
  bool bVar1;
  ConstantValue *pCVar2;
  SVInt *this_00;
  UnaryExpression *in_RSI;
  ConstantValue *in_RDI;
  float v_5;
  double v_4;
  SVInt v_3;
  ConstantValue cv;
  float v_2;
  double v_1;
  SVInt v;
  ConstantValue cv_1;
  LValue lvalue;
  undefined7 in_stack_fffffffffffff948;
  undefined1 in_stack_fffffffffffff94f;
  undefined4 in_stack_fffffffffffff950;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffff954;
  shortreal_t real_01;
  undefined4 in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff95c;
  undefined4 in_stack_fffffffffffff960;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffff964;
  UnaryOperator UVar5;
  SVInt *in_stack_fffffffffffff968;
  undefined5 in_stack_fffffffffffff978;
  undefined1 in_stack_fffffffffffff97d;
  undefined1 in_stack_fffffffffffff97e;
  undefined1 in_stack_fffffffffffff97f;
  shortreal_t local_5c0;
  shortreal_t local_5bc;
  shortreal_t local_5b8;
  float local_5b4;
  real_t local_5a0;
  real_t local_598;
  real_t local_590;
  double local_588;
  uint8_t local_579;
  uint8_t local_562;
  uint8_t local_561;
  uint8_t local_54a;
  uint8_t local_549;
  uint8_t local_532;
  uint8_t local_531;
  uint8_t local_519;
  undefined7 in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffaff;
  shortreal_t local_3c0;
  float local_3bc;
  real_t local_2d8;
  double local_2d0;
  undefined4 local_1d8;
  
  bVar1 = OpInfo::isLValue(in_RSI->op);
  if (bVar1) {
    operand(in_RSI);
    Expression::evalLValue
              ((Expression *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
               (EvalContext *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    LValue::load((LValue *)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8));
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa0e704);
    if (bVar1) {
      bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0xa0e77c);
      if (bVar1) {
        slang::ConstantValue::integer
                  ((ConstantValue *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
        pCVar2 = (ConstantValue *)
                 (*(code *)(&DAT_00b1aca4 +
                           *(int *)(&DAT_00b1aca4 + (ulong)(in_RSI->op - Preincrement) * 4)))();
        return pCVar2;
      }
      bVar1 = slang::ConstantValue::isReal((ConstantValue *)0xa0eb92);
      if (bVar1) {
        local_2d8 = slang::ConstantValue::real
                              ((ConstantValue *)
                               CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
        local_2d0 = real_t::operator_cast_to_double(&local_2d8);
        pCVar2 = (ConstantValue *)
                 (*(code *)(&DAT_00b1ac94 +
                           *(int *)(&DAT_00b1ac94 + (ulong)(in_RSI->op - Preincrement) * 4)))();
        return pCVar2;
      }
      bVar1 = slang::ConstantValue::isShortReal((ConstantValue *)0xa0ef5e);
      if (bVar1) {
        local_3c0 = slang::ConstantValue::shortReal
                              ((ConstantValue *)
                               CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
        local_3bc = shortreal_t::operator_cast_to_float(&local_3c0);
        pCVar2 = (ConstantValue *)
                 (*(code *)(&DAT_00b1ac84 +
                           *(int *)(&DAT_00b1ac84 + (ulong)(in_RSI->op - Preincrement) * 4)))();
        return pCVar2;
      }
    }
    else {
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                 (nullptr_t)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
      local_1d8 = 1;
    }
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xa0f316);
    LValue::~LValue((LValue *)0xa0f323);
  }
  else {
    operand(in_RSI);
    Expression::eval((Expression *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                     (EvalContext *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa0f37b);
    if (bVar1) {
      bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0xa0f3d4);
      if (bVar1) {
        slang::ConstantValue::integer
                  ((ConstantValue *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
        this_00 = (SVInt *)(ulong)in_RSI->op;
        switch(this_00) {
        case (SVInt *)0x0:
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                     (SVInt *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
          local_1d8 = 1;
          break;
        case (SVInt *)0x1:
          SVInt::operator-(this_00);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                     (SVInt *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
          local_1d8 = 1;
          break;
        case (SVInt *)0x2:
          SVInt::operator~(this_00);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                     (SVInt *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
          local_1d8 = 1;
          break;
        case (SVInt *)0x3:
          SVInt::reductionAnd((SVInt *)CONCAT17(in_stack_fffffffffffff97f,
                                                CONCAT16(in_stack_fffffffffffff97e,
                                                         CONCAT15(in_stack_fffffffffffff97d,
                                                                  in_stack_fffffffffffff978))));
          SVInt::SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff964 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                     (SVInt *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
          local_1d8 = 1;
          break;
        case (SVInt *)0x4:
          SVInt::reductionOr(in_stack_fffffffffffff968);
          SVInt::SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff964 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                     (SVInt *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
          local_1d8 = 1;
          break;
        case (SVInt *)0x5:
          local_519 = (uint8_t)SVInt::reductionXor((SVInt *)CONCAT44(in_stack_fffffffffffff95c,
                                                                     in_stack_fffffffffffff958));
          SVInt::SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff964 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                     (SVInt *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
          local_1d8 = 1;
          break;
        case (SVInt *)0x6:
          local_532 = (uint8_t)SVInt::reductionAnd((SVInt *)CONCAT17(in_stack_fffffffffffff97f,
                                                                     CONCAT16(
                                                  in_stack_fffffffffffff97e,
                                                  CONCAT15(in_stack_fffffffffffff97d,
                                                           in_stack_fffffffffffff978))));
          local_531 = (uint8_t)logic_t::operator!((logic_t *)
                                                  CONCAT17(in_stack_fffffffffffff94f,
                                                           in_stack_fffffffffffff948));
          SVInt::SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff964 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                     (SVInt *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
          local_1d8 = 1;
          break;
        case (SVInt *)0x7:
          local_54a = (uint8_t)SVInt::reductionOr(in_stack_fffffffffffff968);
          local_549 = (uint8_t)logic_t::operator!((logic_t *)
                                                  CONCAT17(in_stack_fffffffffffff94f,
                                                           in_stack_fffffffffffff948));
          SVInt::SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff964 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                     (SVInt *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
          local_1d8 = 1;
          break;
        case (SVInt *)0x8:
          local_562 = (uint8_t)SVInt::reductionXor((SVInt *)CONCAT44(in_stack_fffffffffffff95c,
                                                                     in_stack_fffffffffffff958));
          local_561 = (uint8_t)logic_t::operator!((logic_t *)
                                                  CONCAT17(in_stack_fffffffffffff94f,
                                                           in_stack_fffffffffffff948));
          SVInt::SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff964 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                     (SVInt *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
          local_1d8 = 1;
          break;
        case (SVInt *)0x9:
          local_579 = (uint8_t)SVInt::operator!((SVInt *)CONCAT17(in_stack_fffffffffffff94f,
                                                                  in_stack_fffffffffffff948));
          SVInt::SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                       (logic_t)(uint8_t)((uint)in_stack_fffffffffffff964 >> 0x18));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                     (SVInt *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
          local_1d8 = 1;
          break;
        default:
          local_1d8 = 0;
        }
        SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
      }
      else {
        bVar1 = slang::ConstantValue::isReal((ConstantValue *)0xa0f9db);
        if (bVar1) {
          local_590 = slang::ConstantValue::real
                                ((ConstantValue *)
                                 CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
          local_588 = real_t::operator_cast_to_double(&local_590);
          UVar5 = in_RSI->op;
          if (UVar5 == Plus) {
            real_t::real_t(&local_598,local_588);
            real.v._4_4_ = in_stack_fffffffffffff954;
            real.v._0_4_ = in_stack_fffffffffffff950;
            slang::ConstantValue::ConstantValue
                      ((ConstantValue *)
                       CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),real);
            local_1d8 = 1;
          }
          else if (UVar5 == Minus) {
            real_t::real_t(&local_5a0,-local_588);
            real_00.v._4_4_ = in_stack_fffffffffffff954;
            real_00.v._0_4_ = in_stack_fffffffffffff950;
            slang::ConstantValue::ConstantValue
                      ((ConstantValue *)
                       CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),real_00);
            local_1d8 = 1;
          }
          else if (UVar5 == LogicalNot) {
            SVInt::SVInt<bool>((SVInt *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950
                                                ),(bool)in_stack_fffffffffffff94f);
            slang::ConstantValue::ConstantValue
                      ((ConstantValue *)
                       CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                       (SVInt *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
            SVInt::~SVInt((SVInt *)CONCAT44(UVar5,in_stack_fffffffffffff960));
            local_1d8 = 1;
          }
        }
        else {
          bVar1 = slang::ConstantValue::isShortReal((ConstantValue *)0xa0fb8b);
          uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff960);
          if (bVar1) {
            local_5b8 = slang::ConstantValue::shortReal
                                  ((ConstantValue *)
                                   CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
            local_5b4 = shortreal_t::operator_cast_to_float(&local_5b8);
            real_01.v = (float)in_RSI->op;
            if (real_01.v == 0.0) {
              shortreal_t::shortreal_t(&local_5bc,local_5b4);
              slang::ConstantValue::ConstantValue
                        ((ConstantValue *)
                         CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),real_01);
              local_1d8 = 1;
            }
            else if (real_01.v == 1.4013e-45) {
              shortreal_t::shortreal_t(&local_5c0,-local_5b4);
              slang::ConstantValue::ConstantValue
                        ((ConstantValue *)
                         CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),real_01);
              local_1d8 = 1;
            }
            else if (real_01.v == 1.26117e-44) {
              SVInt::SVInt<bool>((SVInt *)CONCAT44(9,in_stack_fffffffffffff950),
                                 (bool)in_stack_fffffffffffff94f);
              slang::ConstantValue::ConstantValue
                        ((ConstantValue *)CONCAT44(real_01.v,in_stack_fffffffffffff950),
                         (SVInt *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
              SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff964,uVar4));
              local_1d8 = 1;
            }
          }
          else if (in_RSI->op == LogicalNot) {
            bVar1 = slang::ConstantValue::isFalse
                              ((ConstantValue *)
                               CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
            uVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff950);
            SVInt::SVInt<bool>((SVInt *)CONCAT44(in_stack_fffffffffffff954,uVar3),
                               (bool)in_stack_fffffffffffff94f);
            slang::ConstantValue::ConstantValue
                      ((ConstantValue *)CONCAT44(in_stack_fffffffffffff954,uVar3),
                       (SVInt *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
            SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffff964,uVar4));
            local_1d8 = 1;
          }
        }
      }
    }
    else {
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                 (nullptr_t)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
      local_1d8 = 1;
    }
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xa0fdd0);
  }
  return in_RDI;
}

Assistant:

ConstantValue UnaryExpression::evalImpl(EvalContext& context) const {
    // Handle operations that require an lvalue up front.
    if (OpInfo::isLValue(op)) {
        LValue lvalue = operand().evalLValue(context);
        ConstantValue cv = lvalue.load();
        if (!cv)
            return nullptr;

        if (cv.isInteger()) {
#define OP(k, val)         \
    case UnaryOperator::k: \
        lvalue.store(val); \
        return v

            SVInt v = std::move(cv).integer();
            switch (op) {
                OP(Preincrement, ++v);
                OP(Predecrement, --v);
                OP(Postincrement, v + 1);
                OP(Postdecrement, v - 1);
                default:
                    SLANG_UNREACHABLE;
            }
#undef OP
        }
        else if (cv.isReal()) {
#define OP(k, val)                 \
    case UnaryOperator::k:         \
        lvalue.store(real_t(val)); \
        return real_t(v)

            double v = cv.real();
            switch (op) {
                OP(Preincrement, ++v);
                OP(Predecrement, --v);
                OP(Postincrement, v + 1);
                OP(Postdecrement, v - 1);
                default:
                    SLANG_UNREACHABLE;
            }
#undef OP
        }
        else if (cv.isShortReal()) {
#define OP(k, val)                      \
    case UnaryOperator::k:              \
        lvalue.store(shortreal_t(val)); \
        return shortreal_t(v)

            float v = cv.shortReal();
            switch (op) {
                OP(Preincrement, ++v);
                OP(Predecrement, --v);
                OP(Postincrement, v + 1);
                OP(Postdecrement, v - 1);
                default:
                    SLANG_UNREACHABLE;
            }
#undef OP
        }

        SLANG_UNREACHABLE;
    }

    ConstantValue cv = operand().eval(context);
    if (!cv)
        return nullptr;

#define OP(k, v)           \
    case UnaryOperator::k: \
        return v;

    if (cv.isInteger()) {
        SVInt v = std::move(cv).integer();
        switch (op) {
            OP(Plus, v);
            OP(Minus, -v);
            OP(BitwiseNot, ~v);
            OP(BitwiseAnd, SVInt(v.reductionAnd()));
            OP(BitwiseOr, SVInt(v.reductionOr()));
            OP(BitwiseXor, SVInt(v.reductionXor()));
            OP(BitwiseNand, SVInt(!v.reductionAnd()));
            OP(BitwiseNor, SVInt(!v.reductionOr()));
            OP(BitwiseXnor, SVInt(!v.reductionXor()));
            OP(LogicalNot, SVInt(!v));
            default:
                break;
        }
    }
    else if (cv.isReal()) {
        double v = cv.real();
        switch (op) {
            OP(Plus, real_t(v));
            OP(Minus, real_t(-v));
            OP(LogicalNot, SVInt(!(bool)v));
            default:
                break;
        }
    }
    else if (cv.isShortReal()) {
        float v = cv.shortReal();
        switch (op) {
            OP(Plus, shortreal_t(v));
            OP(Minus, shortreal_t(-v));
            OP(LogicalNot, SVInt(!(bool)v));
            default:
                break;
        }
    }
    else if (op == UnaryOperator::LogicalNot) {
        return SVInt(cv.isFalse());
    }

#undef OP
    SLANG_UNREACHABLE;
}